

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datamanager.cpp
# Opt level: O3

int DataManager::getNodeId(int index,char *id,Network *nw)

{
  int iVar1;
  Node *pNVar2;
  
  if ((-1 < index) && (iVar1 = Network::count(nw,NODE), index < iVar1)) {
    pNVar2 = Network::node(nw,index);
    strcpy(id,(pNVar2->super_Element).name._M_dataplus._M_p);
    return 0;
  }
  *id = '\0';
  return 0xcd;
}

Assistant:

int DataManager::getNodeId(int index, char* id, Network* nw)
{
    if ( index < 0 || index >= nw->count(Element::NODE) )
    {
        strcpy(id, "");
        return 205;
    }
    strcpy(id, nw->node(index)->name.c_str());
    return 0;
}